

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O2

void __thiscall amrex::IArrayBox::IArrayBox(IArrayBox *this,Box *b,int n,Arena *ar)

{
  int local_c;
  
  BaseFab<int>::BaseFab(&this->super_BaseFab<int>,b,n,ar);
  (this->super_BaseFab<int>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_007d3fc8;
  if (do_initval == '\x01') {
    local_c = 0x7fffffff;
    BaseFab<int>::setVal<(amrex::RunOn)1>(&this->super_BaseFab<int>,&local_c);
  }
  return;
}

Assistant:

IArrayBox::IArrayBox (const Box& b, int n, Arena* ar)
    : BaseFab<int>(b,n,ar)
{
#ifndef AMREX_USE_GPU
    // For debugging purposes
    if ( do_initval ) {
        setVal<RunOn::Host>(std::numeric_limits<int>::max());
    }
#endif
}